

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSAtom JS_NewAtomStr(JSContext *ctx,JSString *p)

{
  int iVar1;
  ulong uVar2;
  JSAtom JVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  uVar2 = *(ulong *)&p->field_0x4;
  uVar4 = (uint)uVar2;
  uVar5 = uVar4 & 0x7fffffff;
  if (0xfffffff5 < uVar5 - 0xb) {
    if ((int)uVar4 < 0) {
      uVar7 = (uint)(ushort)p[1].header.ref_count;
    }
    else {
      uVar7 = (uint)(byte)p[1].header.ref_count;
    }
    uVar6 = (ulong)(uVar7 - 0x30);
    if (uVar7 - 0x30 < 10) {
      if (uVar7 == 0x30) {
        uVar6 = 0;
        if (uVar5 != 1) goto LAB_00119a60;
      }
      else if (1 < uVar5) {
        lVar8 = 0;
        do {
          if ((int)uVar4 < 0) {
            uVar5 = (uint)*(ushort *)((long)&p[1].header.ref_count + lVar8 * 2 + 2);
          }
          else {
            uVar5 = (uint)*(byte *)((long)&p[1].header.ref_count + lVar8 + 1);
          }
          if ((9 < uVar5 - 0x30) ||
             (uVar6 = (ulong)(uVar5 - 0x30) + (uVar6 & 0xffffffff) * 10, uVar6 >> 0x20 != 0))
          goto LAB_00119a60;
          lVar8 = lVar8 + 1;
        } while ((ulong)(uVar4 & 0x7fffffff) - 1 != lVar8);
        if ((int)uVar6 < 0) goto LAB_00119a60;
      }
      iVar1 = (p->header).ref_count;
      (p->header).ref_count = iVar1 + -1;
      if (iVar1 < 2) {
        if (uVar2 >> 0x3e == 0) {
          (*(code *)(ctx->header).link.prev)(&ctx->link);
        }
        else {
          JS_FreeAtomStruct((JSRuntime *)ctx,p);
        }
      }
      return (uint)uVar6 | 0x80000000;
    }
  }
LAB_00119a60:
  JVar3 = __JS_NewAtom((JSRuntime *)ctx,p,1);
  return JVar3;
}

Assistant:

static JSAtom JS_NewAtomStr(JSContext *ctx, JSString *p)
{
    JSRuntime *rt = ctx->rt;
    uint32_t n;
    if (is_num_string(&n, p)) {
        if (n <= JS_ATOM_MAX_INT) {
            js_free_string(rt, p);
            return __JS_AtomFromUInt32(n);
        }
    }
    /* XXX: should generate an exception */
    return __JS_NewAtom(rt, p, JS_ATOM_TYPE_STRING);
}